

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O3

Vec_Ptr_t * Saig_ManWindowCollectPos(Aig_Man_t *p,Vec_Ptr_t *vNodes,Vec_Ptr_t **pvPointers)

{
  uint uVar1;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  Aig_Obj_t *pAVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 1000;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  pVVar2->pArray = ppvVar3;
  if (pvPointers != (Vec_Ptr_t **)0x0) {
    pVVar4 = (Vec_Ptr_t *)malloc(0x10);
    pVVar4->nCap = 1000;
    pVVar4->nSize = 0;
    ppvVar3 = (void **)malloc(8000);
    pVVar4->pArray = ppvVar3;
    *pvPointers = pVVar4;
  }
  if (0 < vNodes->nSize) {
    iVar7 = 0;
    uVar8 = 1000;
    lVar9 = 0;
    do {
      pObj = (Aig_Obj_t *)vNodes->pArray[lVar9];
      pAVar5 = Saig_ObjHasUnlabeledFanout(p,pObj);
      if (pAVar5 != (Aig_Obj_t *)0x0) {
        iVar6 = (int)uVar8;
        if (iVar7 == iVar6) {
          if (iVar6 < 0x10) {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
            }
            pVVar2->pArray = ppvVar3;
            pVVar2->nCap = 0x10;
            uVar8 = 0x10;
          }
          else {
            uVar8 = (ulong)(uint)(iVar6 * 2);
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(uVar8 * 8);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,uVar8 * 8);
            }
            pVVar2->pArray = ppvVar3;
            pVVar2->nCap = iVar6 * 2;
          }
        }
        else {
          ppvVar3 = pVVar2->pArray;
        }
        iVar6 = iVar7 + 1;
        pVVar2->nSize = iVar6;
        ppvVar3[iVar7] = pObj;
        iVar7 = iVar6;
        if (pvPointers != (Vec_Ptr_t **)0x0) {
          pVVar4 = *pvPointers;
          uVar1 = pVVar4->nSize;
          if (uVar1 == pVVar4->nCap) {
            if ((int)uVar1 < 0x10) {
              if (pVVar4->pArray == (void **)0x0) {
                ppvVar3 = (void **)malloc(0x80);
              }
              else {
                ppvVar3 = (void **)realloc(pVVar4->pArray,0x80);
              }
              pVVar4->pArray = ppvVar3;
              pVVar4->nCap = 0x10;
            }
            else {
              if (pVVar4->pArray == (void **)0x0) {
                ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar3 = (void **)realloc(pVVar4->pArray,(ulong)uVar1 << 4);
              }
              pVVar4->pArray = ppvVar3;
              pVVar4->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar3 = pVVar4->pArray;
          }
          iVar6 = pVVar4->nSize;
          pVVar4->nSize = iVar6 + 1;
          ppvVar3[iVar6] = pAVar5;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < vNodes->nSize);
  }
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Saig_ManWindowCollectPos( Aig_Man_t * p, Vec_Ptr_t * vNodes, Vec_Ptr_t ** pvPointers )
{
    Vec_Ptr_t * vNodesPo;
    Aig_Obj_t * pObj, * pPointer;
    int i;
    vNodesPo = Vec_PtrAlloc( 1000 );
    if ( pvPointers )
        *pvPointers = Vec_PtrAlloc( 1000 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( (pPointer = Saig_ObjHasUnlabeledFanout(p, pObj)) )
        {
            Vec_PtrPush( vNodesPo, pObj );
            if ( pvPointers )
                Vec_PtrPush( *pvPointers, pPointer );
        }
    }
    return vNodesPo;
}